

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::BuildBlockHistograms<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,uint8_t *block_ids,
               vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms)

{
  size_t __new_size;
  reference this;
  ulong local_38;
  size_t i;
  size_t num_types;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms_local;
  uint8_t *block_ids_local;
  size_t length_local;
  unsigned_short *data_local;
  
  __new_size = RemapBlockIds(block_ids,length);
  if (__new_size < 0x101) {
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::clear(histograms)
    ;
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
              (histograms,__new_size);
    for (local_38 = 0; local_38 < length; local_38 = local_38 + 1) {
      this = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
             operator[](histograms,(ulong)block_ids[local_38]);
      Histogram<704>::Add(this,(ulong)data[local_38]);
    }
    return;
  }
  __assert_fail("num_types <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                ,0x100,
                "void brotli::BuildBlockHistograms(const DataType *, const size_t, uint8_t *, std::vector<HistogramType> *) [HistogramType = brotli::Histogram<704>, DataType = unsigned short]"
               );
}

Assistant:

void BuildBlockHistograms(const DataType* data, const size_t length,
                          uint8_t* block_ids,
                          std::vector<HistogramType>* histograms) {
  size_t num_types = RemapBlockIds(block_ids, length);
  assert(num_types <= 256);
  histograms->clear();
  histograms->resize(num_types);
  for (size_t i = 0; i < length; ++i) {
    (*histograms)[block_ids[i]].Add(data[i]);
  }
}